

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void highbd_filter_mask_dual(__m128i *p,__m128i *q,__m128i *l,__m128i *bl,__m128i *mask)

{
  __m128i alVar1;
  short sVar2;
  long lVar3;
  __m128i alVar4;
  __m128i alVar5;
  ushort uVar6;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar7;
  short sVar15;
  
  alVar5 = *p;
  alVar4 = *q;
  auVar16 = psubusw((undefined1  [16])alVar5,(undefined1  [16])alVar4);
  auVar19 = psubusw((undefined1  [16])alVar4,(undefined1  [16])alVar5);
  auVar17 = psubusw((undefined1  [16])p[1],(undefined1  [16])q[1]);
  auVar18 = psubusw((undefined1  [16])q[1],(undefined1  [16])p[1]);
  auVar18 = auVar18 | auVar17;
  auVar16 = paddusw(auVar19 | auVar16,auVar19 | auVar16);
  auVar17._0_2_ = auVar18._0_2_ >> 1;
  auVar17._2_2_ = auVar18._2_2_ >> 1;
  auVar17._4_2_ = auVar18._4_2_ >> 1;
  auVar17._6_2_ = auVar18._6_2_ >> 1;
  auVar17._8_2_ = auVar18._8_2_ >> 1;
  auVar17._10_2_ = auVar18._10_2_ >> 1;
  auVar17._12_2_ = auVar18._12_2_ >> 1;
  auVar17._14_2_ = auVar18._14_2_ >> 1;
  auVar17 = paddusw(auVar17,auVar16);
  auVar17 = auVar17 ^ _DAT_004310a0;
  auVar16 = _DAT_004310a0 ^ (undefined1  [16])*bl;
  auVar18._0_2_ = -(ushort)(auVar16._0_2_ < auVar17._0_2_);
  auVar18._2_2_ = -(ushort)(auVar16._2_2_ < auVar17._2_2_);
  auVar18._4_2_ = -(ushort)(auVar16._4_2_ < auVar17._4_2_);
  auVar18._6_2_ = -(ushort)(auVar16._6_2_ < auVar17._6_2_);
  auVar18._8_2_ = -(ushort)(auVar16._8_2_ < auVar17._8_2_);
  auVar18._10_2_ = -(ushort)(auVar16._10_2_ < auVar17._10_2_);
  auVar18._12_2_ = -(ushort)(auVar16._12_2_ < auVar17._12_2_);
  auVar18._14_2_ = -(ushort)(auVar16._14_2_ < auVar17._14_2_);
  auVar16 = paddusw(_DAT_0046b0f0,(undefined1  [16])*l);
  auVar16 = auVar16 & auVar18;
  for (lVar3 = 0x10; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    alVar1 = *(__m128i *)((long)*p + lVar3);
    auVar18 = psubusw((undefined1  [16])alVar1,(undefined1  [16])alVar5);
    auVar17 = psubusw((undefined1  [16])alVar5,(undefined1  [16])alVar1);
    auVar17 = auVar17 | auVar18;
    sVar2 = auVar17._0_2_;
    sVar7 = auVar16._0_2_;
    uVar6 = (ushort)(sVar7 < sVar2) * sVar2 | (ushort)(sVar7 >= sVar2) * sVar7;
    sVar2 = auVar17._2_2_;
    sVar7 = auVar16._2_2_;
    uVar8 = (ushort)(sVar7 < sVar2) * sVar2 | (ushort)(sVar7 >= sVar2) * sVar7;
    sVar2 = auVar17._4_2_;
    sVar7 = auVar16._4_2_;
    uVar9 = (ushort)(sVar7 < sVar2) * sVar2 | (ushort)(sVar7 >= sVar2) * sVar7;
    sVar2 = auVar17._6_2_;
    sVar7 = auVar16._6_2_;
    uVar10 = (ushort)(sVar7 < sVar2) * sVar2 | (ushort)(sVar7 >= sVar2) * sVar7;
    sVar2 = auVar17._8_2_;
    sVar7 = auVar16._8_2_;
    uVar11 = (ushort)(sVar7 < sVar2) * sVar2 | (ushort)(sVar7 >= sVar2) * sVar7;
    sVar2 = auVar17._10_2_;
    sVar7 = auVar16._10_2_;
    uVar12 = (ushort)(sVar7 < sVar2) * sVar2 | (ushort)(sVar7 >= sVar2) * sVar7;
    sVar2 = auVar17._12_2_;
    sVar7 = auVar16._12_2_;
    sVar15 = auVar16._14_2_;
    uVar13 = (ushort)(sVar7 < sVar2) * sVar2 | (ushort)(sVar7 >= sVar2) * sVar7;
    sVar2 = auVar17._14_2_;
    uVar14 = (ushort)(sVar15 < sVar2) * sVar2 | (ushort)(sVar15 >= sVar2) * sVar15;
    alVar5 = *(__m128i *)((long)*q + lVar3);
    auVar16 = psubusw((undefined1  [16])alVar5,(undefined1  [16])alVar4);
    auVar17 = psubusw((undefined1  [16])alVar4,(undefined1  [16])alVar5);
    auVar17 = auVar17 | auVar16;
    sVar2 = auVar17._0_2_;
    auVar16._0_2_ = (ushort)((short)uVar6 < sVar2) * sVar2 | ((short)uVar6 >= sVar2) * uVar6;
    sVar2 = auVar17._2_2_;
    auVar16._2_2_ = (ushort)((short)uVar8 < sVar2) * sVar2 | ((short)uVar8 >= sVar2) * uVar8;
    sVar2 = auVar17._4_2_;
    auVar16._4_2_ = (ushort)((short)uVar9 < sVar2) * sVar2 | ((short)uVar9 >= sVar2) * uVar9;
    sVar2 = auVar17._6_2_;
    auVar16._6_2_ = (ushort)((short)uVar10 < sVar2) * sVar2 | ((short)uVar10 >= sVar2) * uVar10;
    sVar2 = auVar17._8_2_;
    auVar16._8_2_ = (ushort)((short)uVar11 < sVar2) * sVar2 | ((short)uVar11 >= sVar2) * uVar11;
    sVar2 = auVar17._10_2_;
    auVar16._10_2_ = (ushort)((short)uVar12 < sVar2) * sVar2 | ((short)uVar12 >= sVar2) * uVar12;
    sVar2 = auVar17._12_2_;
    auVar16._12_2_ = (ushort)((short)uVar13 < sVar2) * sVar2 | ((short)uVar13 >= sVar2) * uVar13;
    sVar2 = auVar17._14_2_;
    auVar16._14_2_ = (ushort)((short)uVar14 < sVar2) * sVar2 | ((short)uVar14 >= sVar2) * uVar14;
    alVar4 = alVar5;
    alVar5 = alVar1;
  }
  auVar16 = psubusw(auVar16,(undefined1  [16])*l);
  *(ushort *)*mask = -(ushort)(auVar16._0_2_ == 0);
  *(ushort *)((long)*mask + 2) = -(ushort)(auVar16._2_2_ == 0);
  *(ushort *)((long)*mask + 4) = -(ushort)(auVar16._4_2_ == 0);
  *(ushort *)((long)*mask + 6) = -(ushort)(auVar16._6_2_ == 0);
  *(ushort *)(*mask + 1) = -(ushort)(auVar16._8_2_ == 0);
  *(ushort *)((long)*mask + 10) = -(ushort)(auVar16._10_2_ == 0);
  *(ushort *)((long)*mask + 0xc) = -(ushort)(auVar16._12_2_ == 0);
  *(ushort *)((long)*mask + 0xe) = -(ushort)(auVar16._14_2_ == 0);
  return;
}

Assistant:

static inline void highbd_filter_mask_dual(const __m128i *p, const __m128i *q,
                                           const __m128i *l, const __m128i *bl,
                                           __m128i *mask) {
  __m128i abs_p0q0 = abs_diff16(p[0], q[0]);
  __m128i abs_p1q1 = abs_diff16(p[1], q[1]);
  abs_p0q0 = _mm_adds_epu16(abs_p0q0, abs_p0q0);
  abs_p1q1 = _mm_srli_epi16(abs_p1q1, 1);

  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i ffff = _mm_set1_epi16((short)0xFFFF);

  __m128i max = _mm_subs_epu16(_mm_adds_epu16(abs_p0q0, abs_p1q1), *bl);
  max = _mm_xor_si128(_mm_cmpeq_epi16(max, zero), ffff);
  max = _mm_and_si128(max, _mm_adds_epu16(*l, one));

  int i;
  for (i = 1; i < 4; ++i) {
    max = _mm_max_epi16(max, abs_diff16(p[i], p[i - 1]));
    max = _mm_max_epi16(max, abs_diff16(q[i], q[i - 1]));
  }
  max = _mm_subs_epu16(max, *l);
  *mask = _mm_cmpeq_epi16(max, zero);  // return ~mask
}